

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

CustomAttributeSig * __thiscall
winmd::reader::CustomAttribute::Value
          (CustomAttributeSig *__return_storage_ptr__,CustomAttribute *this)

{
  CustomAttributeType CVar1;
  table_base *table;
  coded_index<winmd::reader::CustomAttributeType> cVar2;
  MemberRef MVar3;
  MethodDef MVar4;
  undefined1 local_168 [8];
  byte_view cursor;
  MethodDef local_148;
  table_base *local_138;
  uint32_t local_130;
  MemberRef local_128;
  MethodDefSig local_118;
  MethodDefSig *local_40;
  MethodDefSig *method_sig;
  uint32_t local_30;
  undefined1 local_28 [8];
  coded_index<winmd::reader::CustomAttributeType> ctor;
  CustomAttribute *this_local;
  
  ctor.super_typed_index<winmd::reader::CustomAttributeType>.
  super_index_base<winmd::reader::CustomAttributeType>._8_8_ = this;
  cVar2 = Type(this);
  method_sig = cVar2.super_typed_index<winmd::reader::CustomAttributeType>.
               super_index_base<winmd::reader::CustomAttributeType>.m_table;
  local_30 = cVar2.super_typed_index<winmd::reader::CustomAttributeType>.
             super_index_base<winmd::reader::CustomAttributeType>.m_value;
  local_28 = (undefined1  [8])method_sig;
  ctor.super_typed_index<winmd::reader::CustomAttributeType>.
  super_index_base<winmd::reader::CustomAttributeType>.m_table._0_4_ = local_30;
  CVar1 = index_base<winmd::reader::CustomAttributeType>::type
                    ((index_base<winmd::reader::CustomAttributeType> *)local_28);
  if (CVar1 == MemberRef) {
    MVar3 = typed_index<winmd::reader::CustomAttributeType>::MemberRef
                      ((typed_index<winmd::reader::CustomAttributeType> *)local_28);
    local_138 = MVar3.super_row_base<winmd::reader::MemberRef>.m_table;
    local_130 = MVar3.super_row_base<winmd::reader::MemberRef>.m_index;
    local_128.super_row_base<winmd::reader::MemberRef>.m_table = local_138;
    local_128.super_row_base<winmd::reader::MemberRef>.m_index = local_130;
    MemberRef::MethodSignature(&local_118,&local_128);
  }
  else {
    MVar4 = typed_index<winmd::reader::CustomAttributeType>::MethodDef
                      ((typed_index<winmd::reader::CustomAttributeType> *)local_28);
    cursor.m_last = (uint8_t *)MVar4.super_row_base<winmd::reader::MethodDef>.m_table;
    local_148.super_row_base<winmd::reader::MethodDef>.m_index =
         MVar4.super_row_base<winmd::reader::MethodDef>.m_index;
    local_148.super_row_base<winmd::reader::MethodDef>.m_table = (table_base *)cursor.m_last;
    MethodDef::Signature(&local_118,&local_148);
  }
  local_40 = &local_118;
  row_base<winmd::reader::CustomAttribute>::get_blob
            ((row_base<winmd::reader::CustomAttribute> *)local_168,(uint32_t)this);
  table = row_base<winmd::reader::CustomAttribute>::get_table
                    (&this->super_row_base<winmd::reader::CustomAttribute>);
  CustomAttributeSig::CustomAttributeSig
            (__return_storage_ptr__,table,(byte_view *)local_168,local_40);
  MethodDefSig::~MethodDefSig(&local_118);
  return __return_storage_ptr__;
}

Assistant:

inline auto CustomAttribute::Value() const
    {
        auto const ctor = Type();
        MethodDefSig const& method_sig = ctor.type() == CustomAttributeType::MemberRef ? ctor.MemberRef().MethodSignature() : ctor.MethodDef().Signature();
        auto cursor = get_blob(2);
        return CustomAttributeSig{ get_table(), cursor, method_sig };
    }